

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgemm.hpp
# Opt level: O0

void remora::bindings::
     pack_B_dense<remora::dense_matrix_adaptor<double_const,remora::column_major,remora::dense_tag,remora::cpu_tag>,double,remora::bindings::gemm_block_size<double>>
               (matrix_expression<remora::dense_matrix_adaptor<const_double,_remora::column_major,_remora::dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
                *param_1,long param_2)

{
  dense_matrix_adaptor<const_double,_remora::column_major,_remora::dense_tag,_remora::cpu_tag>
  *pdVar1;
  size_type sVar2;
  size_type sVar3;
  matrix_element<const_double,_remora::column_major> *this;
  ulong uVar4;
  double *pdVar5;
  size_t j;
  size_t i;
  size_t l;
  size_t nu;
  size_t np;
  size_t nc;
  size_t kc;
  matrix_element<const_double,_remora::column_major> B_elem;
  double local_68;
  dense_matrix_adaptor<const_double,_remora::column_major,_remora::dense_tag,_remora::cpu_tag>
  *in_stack_ffffffffffffffa0;
  ulong local_58;
  matrix_element<const_double,_remora::column_major> *j_00;
  size_t i_00;
  
  matrix_expression<remora::dense_matrix_adaptor<const_double,_remora::column_major,_remora::dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
  ::operator()(param_1);
  dense_matrix_adaptor<const_double,_remora::column_major,_remora::dense_tag,_remora::cpu_tag>::
  elements(in_stack_ffffffffffffffa0);
  pdVar1 = matrix_expression<remora::dense_matrix_adaptor<const_double,_remora::column_major,_remora::dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
           ::operator()(param_1);
  sVar2 = dense_matrix_adaptor<const_double,_remora::column_major,_remora::dense_tag,_remora::cpu_tag>
          ::size1(pdVar1);
  pdVar1 = matrix_expression<remora::dense_matrix_adaptor<const_double,_remora::column_major,_remora::dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
           ::operator()(param_1);
  sVar3 = dense_matrix_adaptor<const_double,_remora::column_major,_remora::dense_tag,_remora::cpu_tag>
          ::size2(pdVar1);
  this = (matrix_element<const_double,_remora::column_major> *)((sVar3 + 5) / 6);
  i_00 = 0;
  for (j_00 = (matrix_element<const_double,_remora::column_major> *)0x0; j_00 < this;
      j_00 = (matrix_element<const_double,_remora::column_major> *)
             ((long)&(j_00->m_storage).values + 1)) {
    for (local_58 = 0; local_58 < sVar2; local_58 = local_58 + 1) {
      for (uVar4 = (long)j_00 * 6; uVar4 < (long)j_00 * 6 + 6U; uVar4 = uVar4 + 1) {
        if (uVar4 < sVar3) {
          pdVar5 = device_traits<remora::cpu_tag>::
                   matrix_element<const_double,_remora::column_major>::operator()
                             (this,i_00,(size_t)j_00);
          local_68 = *pdVar5;
        }
        else {
          local_68 = 0.0;
        }
        *(double *)(param_2 + i_00 * 8) = local_68;
        i_00 = i_00 + 1;
      }
    }
  }
  return;
}

Assistant:

void pack_B_dense(matrix_expression<E, cpu_tag> const& B, T* p, block_size)
{
	BOOST_ALIGN_ASSUME_ALIGNED(p, block_size::block::align);
	auto B_elem = B().elements();

	std::size_t const kc = B ().size1();
	std::size_t const nc = B ().size2();
	static std::size_t const NR = block_size::nr;
	std::size_t const np = (nc+NR-1) / NR;

	std::size_t nu = 0;
	for (std::size_t l=0; l<np; ++l) {
		for (std::size_t i=0; i<kc; ++i) {
			for (std::size_t j = l*NR; j < l*NR + NR; ++j,++nu){
				p[nu] = (j<nc) ? B_elem(i,j) : T(0);
			}
		}
	}
}